

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseReader.cpp
# Opt level: O0

void __thiscall
license::FullLicenseInfo::FullLicenseInfo
          (FullLicenseInfo *this,string *source,string *product,string *license_signature)

{
  string *license_signature_local;
  string *product_local;
  string *source_local;
  FullLicenseInfo *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)license_signature);
  std::__cxx11::string::string((string *)&this->source,(string *)source);
  std::__cxx11::string::string((string *)&this->m_project,(string *)product);
  this->m_magic = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->m_limits);
  return;
}

Assistant:

FullLicenseInfo::FullLicenseInfo(const string &source, const string &product, const string &license_signature)
	: source(source),
	  m_project(product),  //
	  license_signature(license_signature),
	  m_magic(0) {}